

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPOMDPPlanner.cpp
# Opt level: O0

QFunctionsDiscrete * __thiscall
MonahanPOMDPPlanner::BackupStage(MonahanPOMDPPlanner *this,QFunctionsDiscrete *Q,size_t maxNrAlphas)

{
  size_t sVar1;
  reference pvVar2;
  size_type sVar3;
  ostream *this_00;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_RCX;
  MonahanPlanner *in_RSI;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RDI;
  GaoVectorSetIndex a;
  size_t nrVectorsComputed;
  GaoVectorSet G;
  int nrA;
  QFunctionsDiscrete *Q1;
  AlphaVectorPlanning *in_stack_fffffffffffffed8;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffffee0;
  ostream *in_stack_fffffffffffffef0;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *__n;
  QFunctionsDiscrete *Q_00;
  size_type local_e0;
  ValueFunctionPOMDPDiscrete *in_stack_ffffffffffffff50;
  AlphaVectorPlanning *in_stack_ffffffffffffff58;
  QFunctionsDiscrete local_26;
  
  __n = in_RDI;
  local_26.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._6_8_ = in_RCX;
  AlphaVectorPlanning::GetPU(in_stack_fffffffffffffed8);
  sVar1 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x929cde);
  local_26.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._2_4_ = (int)sVar1;
  local_26.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
  Q_00 = &local_26;
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x929d0c);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)in_RSI,(size_type)__n,(allocator_type *)in_stack_fffffffffffffef0);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::~allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x929d2f);
  AlphaVectorPlanning::QFunctionsToValueFunction(Q_00);
  AlphaVectorPlanning::BackProject(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffef0);
  std::operator<<((ostream *)&std::cout,"MonahanPOMDPPlanner::BackupStage <");
  std::ostream::flush();
  for (local_e0 = 0;
      local_e0 !=
      (long)local_26.
            super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._2_4_; local_e0 = local_e0 + 1) {
    MonahanCrossSum((MonahanPOMDPPlanner *)G.base_,(GaoVectorSet *)G._104_8_,
                    (QFunctionsDiscrete *)
                    G.
                    super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                    .
                    super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                    .num_elements_,
                    G.
                    super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                    .
                    super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                    .directional_offset_._4_4_,
                    G.
                    super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                    .
                    super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                    .directional_offset_._3_1_,
                    G.
                    super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                    .
                    super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                    .origin_offset_);
    pvVar2 = std::
             vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ::operator[](in_RDI,local_e0);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(pvVar2);
    in_stack_fffffffffffffef0 = std::operator<<((ostream *)&std::cout," ");
    pvVar2 = std::
             vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ::operator[](in_RDI,local_e0);
    sVar3 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(pvVar2);
    std::ostream::operator<<(in_stack_fffffffffffffef0,sVar3);
    std::ostream::flush();
    in_stack_fffffffffffffee0 =
         (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          *)local_26.
            super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            ._M_impl.super__Vector_impl_data._6_8_;
    MonahanPlanner::GetNrVectors(in_RSI);
    MonahanPlanner::CheckMaxNrVectors
              ((MonahanPlanner *)
               G.
               super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
               .
               super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
               .origin_offset_,
               G.
               super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
               .
               super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
               .index_base_list_.elems[1],
               G.
               super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
               .
               super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
               .index_base_list_.elems[0]);
  }
  this_00 = std::operator<<((ostream *)&std::cout,">");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_26.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = 1;
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(in_stack_fffffffffffffee0);
  if ((local_26.
       super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._1_1_ & 1) == 0) {
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)in_stack_fffffffffffffef0);
  }
  return __n;
}

Assistant:

QFunctionsDiscrete 
MonahanPOMDPPlanner::BackupStage(const QFunctionsDiscrete &Q,
                                 size_t maxNrAlphas)
{
    int nrA=GetPU()->GetNrJointActions();
    QFunctionsDiscrete Q1(nrA);

    GaoVectorSet G=BackProject(QFunctionsToValueFunction(Q));

    size_t nrVectorsComputed=0;

    // Do the cross-sums, results are stored in V1
    cout << "MonahanPOMDPPlanner::BackupStage <"; cout.flush();
    for(GaoVectorSetIndex a=0;a!=nrA;a++)
    {
        MonahanCrossSum(G,Q1,a,_m_doIncPrune,maxNrAlphas);
        nrVectorsComputed+=Q1[a].size();
        cout << " " << Q1[a].size(); cout.flush();
        CheckMaxNrVectors(maxNrAlphas,GetNrVectors()+nrVectorsComputed);
    }
    cout << ">" << endl;
    return(Q1);
}